

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O2

char * owner_parse(char *spec,int *uid,int *gid)

{
  byte bVar1;
  char *in_RAX;
  group *pgVar2;
  char *__name;
  passwd *ppVar3;
  int *piVar4;
  ulong uVar5;
  char *pcVar6;
  size_t __n;
  char *end;
  
  *uid = -1;
  *gid = -1;
  bVar1 = *spec;
  if (bVar1 == 0) {
    pcVar6 = "Invalid empty user/group spec";
  }
  else {
    end = in_RAX;
    if ((bVar1 == 0x2e) || (bVar1 == 0x3a)) {
      pcVar6 = spec + 1;
    }
    else {
      __n = 0;
      while ((0x3a < bVar1 || ((0x400400000000001U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
        bVar1 = spec[__n + 1];
        __n = __n + 1;
      }
      __name = (char *)malloc(__n + 1);
      if (__name == (char *)0x0) {
        return "Couldn\'t allocate memory";
      }
      memcpy(__name,spec,__n);
      __name[__n] = '\0';
      ppVar3 = getpwnam(__name);
      if (ppVar3 == (passwd *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtoul(__name,&end,10);
        *uid = (int)uVar5;
        if ((*piVar4 != 0) || (*end != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'",__name);
          owner_parse::errbuff[0x7f] = '\0';
          free(__name);
          return owner_parse::errbuff;
        }
      }
      else {
        *uid = ppVar3->pw_uid;
        if (spec[__n] != '\0') {
          *gid = ppVar3->pw_gid;
        }
      }
      pcVar6 = spec + __n + (bVar1 != 0);
      free(__name);
    }
    if (*pcVar6 != '\0') {
      pgVar2 = getgrnam(pcVar6);
      if (pgVar2 == (group *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtoul(pcVar6,&end,10);
        *gid = (int)uVar5;
        if ((*piVar4 != 0) || (*end != '\0')) {
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",pcVar6);
          owner_parse::errbuff[0x7f] = '\0';
          return owner_parse::errbuff;
        }
      }
      else {
        *gid = pgVar2->gr_gid;
      }
    }
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

const char *
owner_parse(const char *spec, int *uid, int *gid)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	*uid = -1;
	*gid = -1;

	if (spec[0] == '\0')
		return ("Invalid empty user/group spec");

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = (char *)malloc(ue - u + 1);
		if (user == NULL)
			return ("Couldn't allocate memory");
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			*uid = pwent->pw_uid;
			if (*ue != '\0')
				*gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			*uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				return (errbuff);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			*gid = grp->gr_gid;
		} else {
			char *end;
			errno = 0;
			*gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				return (errbuff);
			}
		}
	}
	return (NULL);
}